

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *pNtk,int fDuplicate)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Abc_Obj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  Vec_Ptr_t *p;
  char *__s2;
  Abc_Obj_t *pAVar9;
  Abc_Obj_t *pFanin_00;
  char *pcVar10;
  Abc_Obj_t *local_98;
  int local_84;
  int local_80;
  int nDupGates_1;
  int nDupBufs;
  int fHasOther;
  int fHasInv;
  int fHasDir;
  Vec_Ptr_t *vFanouts;
  int local_60;
  int nDupChange;
  int nDupInvs;
  int nDupGates;
  int nTotal;
  int LevelMax;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pDriverNew;
  Abc_Obj_t *pDriver;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vCoTerms;
  Vec_Ptr_t *vDrivers;
  int fAddBuffers;
  int fDuplicate_local;
  Abc_Ntk_t *pNtk_local;
  
  nDupInvs = 0;
  iVar4 = Abc_NtkIsLogic(pNtk);
  if (iVar4 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                  ,0x43d,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
  }
  iVar4 = Abc_NtkLevel(pNtk);
  for (LevelMax = 0; iVar5 = Abc_NtkCoNum(pNtk), LevelMax < iVar5; LevelMax = LevelMax + 1) {
    pAVar7 = Abc_NtkCo(pNtk,LevelMax);
    pAVar9 = Abc_ObjFanin0(pAVar7);
    iVar5 = Abc_NodeIsConst(pAVar9);
    if (iVar5 != 0) {
      iVar5 = Abc_ObjFaninC0(pAVar7);
      iVar6 = Abc_NodeIsConst0(pAVar9);
      if (iVar5 == iVar6) {
        local_98 = Abc_NtkCreateNodeConst1(pNtk);
      }
      else {
        local_98 = Abc_NtkCreateNodeConst0(pNtk);
      }
      iVar5 = Abc_ObjFaninC0(pAVar7);
      if (iVar5 != 0) {
        Abc_ObjXorFaninC(pAVar7,0);
      }
      Abc_ObjPatchFanin(pAVar7,pAVar9,local_98);
      iVar5 = Abc_ObjFanoutNum(pAVar9);
      if (iVar5 == 0) {
        Abc_NtkDeleteObj(pAVar9);
      }
    }
  }
  pVVar8 = Vec_PtrAlloc(100);
  Abc_NtkIncrementTravId(pNtk);
  for (LevelMax = 0; iVar5 = Abc_NtkCoNum(pNtk), LevelMax < iVar5; LevelMax = LevelMax + 1) {
    pAVar7 = Abc_NtkCo(pNtk,LevelMax);
    iVar5 = Abc_ObjFaninC0(pAVar7);
    if (iVar5 != 0) {
      pAVar7 = Abc_ObjFanin0(pAVar7);
      iVar5 = Abc_NodeIsTravIdCurrent(pAVar7);
      if (iVar5 == 0) {
        Abc_NodeSetTravIdCurrent(pAVar7);
        Vec_PtrPush(pVVar8,pAVar7);
      }
    }
  }
  iVar5 = Vec_PtrSize(pVVar8);
  if (0 < iVar5) {
    nDupChange = 0;
    local_60 = 0;
    p = Vec_PtrAlloc(100);
    for (LevelMax = 0; iVar5 = Vec_PtrSize(pVVar8), LevelMax < iVar5; LevelMax = LevelMax + 1) {
      pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(pVVar8,LevelMax);
      bVar2 = false;
      bVar1 = false;
      bVar3 = false;
      for (nTotal = 0; iVar5 = Abc_ObjFanoutNum(pAVar7), nTotal < iVar5; nTotal = nTotal + 1) {
        pAVar9 = Abc_ObjFanout(pAVar7,nTotal);
        iVar5 = Abc_ObjIsCo(pAVar9);
        if (iVar5 == 0) {
          iVar5 = Abc_ObjFaninC0(pAVar9);
          if (iVar5 != 0) {
            __assert_fail("!Abc_ObjFaninC0(pNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                          ,0x468,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
          }
          bVar3 = true;
        }
        else {
          iVar5 = Abc_ObjFaninC0(pAVar9);
          if (iVar5 == 0) {
            bVar2 = true;
          }
          else {
            bVar1 = true;
          }
        }
      }
      if (!bVar1) {
        __assert_fail("fHasInv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                      ,0x471,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
      }
      iVar5 = Abc_ObjIsCi(pAVar7);
      if (((iVar5 != 0) || (bVar2)) || ((bVar3 && (iVar5 = Abc_NtkHasMapping(pNtk), iVar5 != 0)))) {
        if (((fDuplicate == 0) || (iVar5 = Abc_ObjIsNode(pAVar7), iVar5 == 0)) ||
           (iVar5 = Abc_ObjLevel(pAVar7), iVar5 != iVar4)) {
          pFanin = Abc_NtkCreateNodeInv(pNtk,pAVar7);
          local_60 = local_60 + 1;
        }
        else {
          pFanin = Abc_NtkDupObj(pNtk,pAVar7,0);
          for (nTotal = 0; iVar5 = Abc_ObjFaninNum(pAVar7), nTotal < iVar5; nTotal = nTotal + 1) {
            pAVar9 = Abc_ObjFanin(pAVar7,nTotal);
            Abc_ObjAddFanin(pFanin,pAVar9);
          }
          Abc_NodeComplement(pFanin);
          nDupChange = nDupChange + 1;
        }
        Vec_PtrClear(p);
        for (nTotal = 0; iVar5 = Abc_ObjFanoutNum(pAVar7), nTotal < iVar5; nTotal = nTotal + 1) {
          pAVar9 = Abc_ObjFanout(pAVar7,nTotal);
          iVar5 = Abc_ObjIsCo(pAVar9);
          if ((iVar5 != 0) && (iVar5 = Abc_ObjFaninC0(pAVar9), iVar5 != 0)) {
            Vec_PtrPush(p,pAVar9);
          }
        }
        iVar5 = Vec_PtrSize(p);
        if (iVar5 < 1) {
          __assert_fail("Vec_PtrSize(vFanouts) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                        ,0x487,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
        }
        for (nTotal = 0; iVar5 = Vec_PtrSize(p), nTotal < iVar5; nTotal = nTotal + 1) {
          pAVar9 = (Abc_Obj_t *)Vec_PtrEntry(p,nTotal);
          Abc_ObjXorFaninC(pAVar9,0);
          Abc_ObjPatchFanin(pAVar9,pAVar7,pFanin);
          iVar5 = Abc_ObjIsCi(pAVar7);
          if ((iVar5 == 0) && (iVar5 = Abc_ObjFanoutNum(pAVar7), iVar5 < 1)) {
            __assert_fail("Abc_ObjIsCi(pDriver) || Abc_ObjFanoutNum(pDriver) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                          ,0x48c,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
          }
        }
      }
      else {
        iVar5 = Abc_ObjIsNode(pAVar7);
        if (iVar5 == 0) {
          __assert_fail("Abc_ObjIsNode(pDriver)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                        ,0x492,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
        }
        Abc_NodeComplement(pAVar7);
        for (nTotal = 0; iVar5 = Abc_ObjFanoutNum(pAVar7), nTotal < iVar5; nTotal = nTotal + 1) {
          pAVar9 = Abc_ObjFanout(pAVar7,nTotal);
          iVar5 = Abc_ObjIsCo(pAVar9);
          if (iVar5 == 0) {
            iVar5 = Abc_ObjIsNode(pAVar9);
            if (iVar5 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                            ,0x49d,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
            }
            Abc_NodeComplementInput(pAVar9,pAVar7);
          }
          else {
            iVar5 = Abc_ObjFaninC0(pAVar9);
            if (iVar5 == 0) {
              __assert_fail("Abc_ObjFaninC0(pNode)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                            ,0x498,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
            }
            Abc_ObjXorFaninC(pAVar9,0);
          }
        }
      }
    }
    Vec_PtrFree(p);
    nDupInvs = local_60 + nDupChange;
  }
  Vec_PtrFree(pVVar8);
  pVVar8 = Vec_PtrAlloc(100);
  Abc_NtkIncrementTravId(pNtk);
  LevelMax = 0;
  do {
    iVar5 = Abc_NtkCoNum(pNtk);
    if (iVar5 <= LevelMax) {
      iVar5 = Vec_PtrSize(pVVar8);
      if (0 < iVar5) {
        local_80 = 0;
        local_84 = 0;
        for (LevelMax = 0; iVar5 = Vec_PtrSize(pVVar8), LevelMax < iVar5; LevelMax = LevelMax + 1) {
          pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(pVVar8,LevelMax);
          pAVar9 = Abc_ObjFanin0(pAVar7);
          if (((fDuplicate == 0) || (iVar5 = Abc_ObjIsNode(pAVar9), iVar5 == 0)) ||
             ((iVar5 = Abc_NtkHasMapping(pNtk), iVar5 == 0 &&
              (iVar5 = Abc_ObjLevel(pAVar9), iVar5 != iVar4)))) {
            pFanin = Abc_NtkCreateNodeBuf(pNtk,pAVar9);
            pcVar10 = Abc_ObjName(pAVar9);
            Abc_ObjAssignName(pFanin,pcVar10,"_buf");
            local_80 = local_80 + 1;
          }
          else {
            pFanin = Abc_NtkDupObj(pNtk,pAVar9,0);
            for (nTotal = 0; iVar5 = Abc_ObjFaninNum(pAVar9), nTotal < iVar5; nTotal = nTotal + 1) {
              pFanin_00 = Abc_ObjFanin(pAVar9,nTotal);
              Abc_ObjAddFanin(pFanin,pFanin_00);
            }
            local_84 = local_84 + 1;
          }
          Abc_ObjPatchFanin(pAVar7,pAVar9,pFanin);
          iVar5 = Abc_ObjIsCi(pAVar9);
          if ((iVar5 == 0) && (iVar5 = Abc_ObjFanoutNum(pAVar9), iVar5 < 1)) {
            __assert_fail("Abc_ObjIsCi(pDriver) || Abc_ObjFanoutNum(pDriver) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                          ,0x4e0,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
          }
        }
        nDupInvs = local_80 + local_84 + nDupInvs;
      }
      Vec_PtrFree(pVVar8);
      return nDupInvs;
    }
    pAVar7 = Abc_NtkCo(pNtk,LevelMax);
    pAVar9 = Abc_ObjFanin0(pAVar7);
    iVar5 = Abc_ObjIsCi(pAVar9);
    if (iVar5 == 0) {
LAB_00b22de8:
      iVar5 = Abc_NodeIsTravIdCurrent(pAVar9);
      if (iVar5 == 0) {
        pAVar7 = (Abc_Obj_t *)Abc_ObjName(pAVar7);
        pAVar9->pNext = pAVar7;
        Abc_NodeSetTravIdCurrent(pAVar9);
      }
      else {
        pAVar9 = pAVar9->pNext;
        pcVar10 = Abc_ObjName(pAVar7);
        iVar5 = strcmp((char *)pAVar9,pcVar10);
        if (iVar5 != 0) {
          Vec_PtrPush(pVVar8,pAVar7);
        }
      }
    }
    else {
      pcVar10 = Abc_ObjName(pAVar9);
      __s2 = Abc_ObjName(pAVar7);
      iVar5 = strcmp(pcVar10,__s2);
      if (iVar5 == 0) goto LAB_00b22de8;
      Vec_PtrPush(pVVar8,pAVar7);
    }
    LevelMax = LevelMax + 1;
  } while( true );
}

Assistant:

int Abc_NtkLogicMakeSimpleCos( Abc_Ntk_t * pNtk, int fDuplicate )
{
    int fAddBuffers = 1;
    Vec_Ptr_t * vDrivers, * vCoTerms;
    Abc_Obj_t * pNode, * pDriver, * pDriverNew, * pFanin;
    int i, k, LevelMax, nTotal = 0;
    assert( Abc_NtkIsLogic(pNtk) );
    LevelMax = Abc_NtkLevel(pNtk);
//    Abc_NtkLogicMakeSimpleCosTest( pNtk, fDuplicate );

    // fix constant drivers
    Abc_NtkForEachCo( pNtk, pNode, i ) 
    {
        pDriver = Abc_ObjFanin0(pNode);
        if ( !Abc_NodeIsConst(pDriver) )
            continue;
        pDriverNew = (Abc_ObjFaninC0(pNode) == Abc_NodeIsConst0(pDriver)) ? Abc_NtkCreateNodeConst1(pNtk) : Abc_NtkCreateNodeConst0(pNtk);
        if ( Abc_ObjFaninC0(pNode) )
            Abc_ObjXorFaninC( pNode, 0 );
        Abc_ObjPatchFanin( pNode, pDriver, pDriverNew );
        if ( Abc_ObjFanoutNum(pDriver) == 0 )
            Abc_NtkDeleteObj( pDriver );
    }

    // collect drivers pointed by complemented edges
    vDrivers = Vec_PtrAlloc( 100 );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCo( pNtk, pNode, i ) 
    {
        if ( !Abc_ObjFaninC0(pNode) )
            continue;
        pDriver = Abc_ObjFanin0(pNode);
        if ( Abc_NodeIsTravIdCurrent(pDriver) )
            continue;
        Abc_NodeSetTravIdCurrent(pDriver);
        Vec_PtrPush( vDrivers, pDriver );
    }
    // fix complemented drivers
    if ( Vec_PtrSize(vDrivers) > 0 )
    {
        int nDupGates = 0, nDupInvs = 0, nDupChange = 0;
        Vec_Ptr_t * vFanouts = Vec_PtrAlloc( 100 );
        Vec_PtrForEachEntry( Abc_Obj_t *, vDrivers, pDriver, i )
        {
            int fHasDir = 0, fHasInv = 0, fHasOther = 0;
            Abc_ObjForEachFanout( pDriver, pNode, k )
            {
                if ( !Abc_ObjIsCo(pNode) )
                {
                    assert( !Abc_ObjFaninC0(pNode) );
                    fHasOther = 1;
                    continue;
                }
                if ( Abc_ObjFaninC0(pNode) )
                    fHasInv = 1;
                else //if ( Abc_ObjFaninC0(pNode) )
                    fHasDir = 1;
            }
            assert( fHasInv );
            if ( Abc_ObjIsCi(pDriver) || fHasDir || (fHasOther && Abc_NtkHasMapping(pNtk)) ) // cannot change
            {
                // duplicate if critical
                if ( fDuplicate && Abc_ObjIsNode(pDriver) && Abc_ObjLevel(pDriver) == LevelMax )
                {
                    pDriverNew = Abc_NtkDupObj( pNtk, pDriver, 0 ); 
                    Abc_ObjForEachFanin( pDriver, pFanin, k )
                        Abc_ObjAddFanin( pDriverNew, pFanin );
                    Abc_NodeComplement( pDriverNew );
                    nDupGates++;
                }
                else // add inverter
                {
                    pDriverNew = Abc_NtkCreateNodeInv( pNtk, pDriver );
                    nDupInvs++;
                }
                // collect CO fanouts to be redirected to the new node
                Vec_PtrClear( vFanouts );
                Abc_ObjForEachFanout( pDriver, pNode, k )
                    if ( Abc_ObjIsCo(pNode) && Abc_ObjFaninC0(pNode) )
                        Vec_PtrPush( vFanouts, pNode );
                assert( Vec_PtrSize(vFanouts) > 0 );
                Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pNode, k )
                {
                    Abc_ObjXorFaninC( pNode, 0 );
                    Abc_ObjPatchFanin( pNode, pDriver, pDriverNew );
                    assert( Abc_ObjIsCi(pDriver) || Abc_ObjFanoutNum(pDriver) > 0 );
                }
            }
            else // can change
            {
                // change polarity of the driver
                assert( Abc_ObjIsNode(pDriver) );
                Abc_NodeComplement( pDriver );
                Abc_ObjForEachFanout( pDriver, pNode, k )
                {
                    if ( Abc_ObjIsCo(pNode) )
                    {
                        assert( Abc_ObjFaninC0(pNode) );
                        Abc_ObjXorFaninC( pNode, 0 );
                    }
                    else if ( Abc_ObjIsNode(pNode) )
                        Abc_NodeComplementInput( pNode, pDriver );
                    else assert( 0 );
                }
                nDupChange++;
            }
        }
        Vec_PtrFree( vFanouts );
//        printf( "Resolving inverted CO drivers: Invs = %d. Dups = %d. Changes = %d.\n",
//            nDupInvs, nDupGates, nDupChange );
        nTotal += nDupInvs + nDupGates;
    }
    Vec_PtrFree( vDrivers );

    // collect COs that needs fixing by adding buffers or duplicating
    vCoTerms = Vec_PtrAlloc( 100 );
    Abc_NtkIncrementTravId( pNtk );
    
    // The following cases should be addressed only if the network is written 
    // into a BLIF file. Otherwise, it is possible to skip them:
    // (1) if a CO points to a CI with a different name
    // (2) if an internal node drives more than one CO
    if ( fAddBuffers )
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        // if the driver is a CI and has different name, this is an error
        pDriver = Abc_ObjFanin0(pNode);
        if ( Abc_ObjIsCi(pDriver) && strcmp(Abc_ObjName(pDriver), Abc_ObjName(pNode)) )
        {
            Vec_PtrPush( vCoTerms, pNode );
            continue;
        }
        // if the driver is visited for the first time, remember the CO name
        if ( !Abc_NodeIsTravIdCurrent(pDriver) )
        {
            pDriver->pNext = (Abc_Obj_t *)Abc_ObjName(pNode);
            Abc_NodeSetTravIdCurrent(pDriver);
            continue;
        }
        // the driver has second CO - if they have different name, this is an error
        if ( strcmp((char *)pDriver->pNext, Abc_ObjName(pNode)) ) // diff names
        {
            Vec_PtrPush( vCoTerms, pNode );
            continue;
        }
    }
    // fix duplication problem
    if ( Vec_PtrSize(vCoTerms) > 0 )
    {
        int nDupBufs = 0, nDupGates = 0;
        Vec_PtrForEachEntry( Abc_Obj_t *, vCoTerms, pNode, i )
        {
            pDriver = Abc_ObjFanin0(pNode);
            // duplicate if critical
            if ( fDuplicate && Abc_ObjIsNode(pDriver) && (Abc_NtkHasMapping(pNtk) || Abc_ObjLevel(pDriver) == LevelMax) )
            {
                pDriverNew = Abc_NtkDupObj( pNtk, pDriver, 0 ); 
                Abc_ObjForEachFanin( pDriver, pFanin, k )
                    Abc_ObjAddFanin( pDriverNew, pFanin );
                nDupGates++;
            }
            else // add buffer
            {
                pDriverNew = Abc_NtkCreateNodeBuf( pNtk, pDriver );
                Abc_ObjAssignName( pDriverNew, Abc_ObjName(pDriver), "_buf" );
                nDupBufs++;
            }
            // swing the PO
            Abc_ObjPatchFanin( pNode, pDriver, pDriverNew );
            assert( Abc_ObjIsCi(pDriver) || Abc_ObjFanoutNum(pDriver) > 0 );
        }
//        printf( "Resolving shared CO drivers: Bufs = %d. Dups = %d.\n", nDupBufs, nDupGates );
        nTotal += nDupBufs + nDupGates;
    }
    Vec_PtrFree( vCoTerms );
    return nTotal;
}